

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void module_free_common(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ly_ctx *ctx;
  lys_ident *plVar1;
  lys_module *module_00;
  lys_feature *plVar2;
  ly_ctx *ctx_00;
  lys_deviation *plVar3;
  lys_node *plVar4;
  lys_unique *plVar5;
  lys_ext *plVar6;
  ushort uVar7;
  lys_unique *plVar8;
  lys_deviate *plVar9;
  lys_node *plVar10;
  int shallow;
  long lVar11;
  ulong uVar12;
  LYS_NODE LVar13;
  lys_node *plVar14;
  lys_node *plVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  ctx = module->ctx;
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0xa16,
                  "void module_free_common(struct lys_module *, void (*)(const struct lys_node *, void *))"
                 );
  }
  if (module->imp_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar11 + -8));
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar11 + 0x18));
      lydict_remove(ctx,*(char **)(module->imp->rev + lVar11 + 0x20));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(module->imp->rev + lVar11 + 0x10),
                 (uint)(byte)module->imp->rev[lVar11 + 0xb]);
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x38;
    } while (uVar16 < module->imp_size);
  }
  free(module->imp);
  if ((module->field_0x40 & 1) == 0) {
    plVar4 = module->data;
    while (plVar4 != (lys_node *)0x0) {
      plVar14 = plVar4->next;
      lys_node_free(plVar4,private_destructor,0);
      plVar4 = plVar14;
    }
  }
  lydict_remove(ctx,module->dsc);
  lydict_remove(ctx,module->ref);
  lydict_remove(ctx,module->org);
  lydict_remove(ctx,module->contact);
  lydict_remove(ctx,module->filepath);
  if (module->rev_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(module->rev->date + lVar11 + 0x10),
                 (uint)(byte)module->rev->date[lVar11 + 0xb]);
      lydict_remove(ctx,*(char **)(module->rev->date + lVar11 + 0x18));
      lydict_remove(ctx,*(char **)(module->rev->date + lVar11 + 0x20));
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x28;
    } while (uVar16 < module->rev_size);
  }
  free(module->rev);
  uVar7 = module->ident_size;
  if (uVar7 != 0) {
    lVar11 = 0x40;
    uVar16 = 0;
    do {
      plVar1 = module->ident;
      if (plVar1 != (lys_ident *)0x0) {
        free(*(void **)(plVar1->padding + lVar11 + -0x24));
        ly_set_free(*(ly_set **)(plVar1->padding + lVar11 + -0x1c));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar11 + -0x5c));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar11 + -0x54));
        lydict_remove(ctx,*(char **)(plVar1->padding + lVar11 + -0x4c));
        lys_iffeature_free(ctx,*(lys_iffeature **)(plVar1->padding + lVar11 + -0x34),
                           plVar1->padding[lVar11 + -0x41]);
        lys_extension_instances_free
                  (ctx,*(lys_ext_instance ***)(plVar1->padding + lVar11 + -0x3c),
                   (uint)plVar1->padding[lVar11 + -0x42]);
        uVar7 = module->ident_size;
      }
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x48;
    } while (uVar16 < uVar7);
  }
  module->ident_size = 0;
  free(module->ident);
  if (module->tpdf_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      lys_tpdf_free(ctx,(lys_tpdf *)(module->tpdf->padding + lVar11 + -0x1c));
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x80;
    } while (uVar16 < module->tpdf_size);
  }
  free(module->tpdf);
  lys_extension_instances_free(ctx,module->ext,(uint)module->ext_size);
  if (module->inc_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      lydict_remove(ctx,*(char **)(module->inc->rev + lVar11 + 0x18));
      lydict_remove(ctx,*(char **)(module->inc->rev + lVar11 + 0x20));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(module->inc->rev + lVar11 + 0x10),
                 (uint)(byte)module->inc->rev[lVar11 + 0xb]);
      if (((module->field_0x40 & 1) == 0) &&
         (module_00 = *(lys_module **)(module->inc->rev + lVar11 + -8),
         module_00 != (lys_module *)0x0)) {
        module_free_common(module_00,private_destructor);
        free(module_00);
      }
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x30;
    } while (uVar16 < module->inc_size);
  }
  free(module->inc);
  if (module->augment_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      lys_augment_free(ctx,(lys_node_augment *)(module->augment->padding + lVar11 + -0x1c),
                       private_destructor);
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x68;
    } while (uVar16 < module->augment_size);
  }
  free(module->augment);
  if (module->features_size != '\0') {
    lVar11 = 0;
    uVar16 = 0;
    do {
      plVar2 = module->features;
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar11 + -0x1c));
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar11 + -0x14));
      lydict_remove(ctx,*(char **)(plVar2->padding + lVar11 + -0xc));
      lys_iffeature_free(ctx,*(lys_iffeature **)(plVar2->padding + lVar11 + 0xc),
                         plVar2->padding[lVar11 + -1]);
      ly_set_free(*(ly_set **)(plVar2->padding + lVar11 + 0x1c));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(plVar2->padding + lVar11 + 4),
                 (uint)plVar2->padding[lVar11 + -2]);
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x40;
    } while (uVar16 < module->features_size);
  }
  free(module->features);
  if (module->deviation_size != '\0') {
    uVar16 = 0;
    do {
      ctx_00 = module->ctx;
      plVar3 = module->deviation;
      lydict_remove(ctx_00,plVar3[uVar16].target_name);
      lydict_remove(ctx_00,plVar3[uVar16].dsc);
      lydict_remove(ctx_00,plVar3[uVar16].ref);
      lys_extension_instances_free(ctx_00,plVar3[uVar16].ext,(uint)plVar3[uVar16].ext_size);
      if (plVar3[uVar16].deviate != (lys_deviate *)0x0) {
        plVar4 = plVar3[uVar16].orig_node;
        if ((plVar3[uVar16].deviate)->mod == LY_DEVIATE_NO) {
          shallow = 0;
          plVar14 = plVar4;
          if (plVar4 != (lys_node *)0x0) {
            while( true ) {
              do {
                plVar10 = plVar14;
                plVar10->module = module;
                plVar14 = plVar10->child;
              } while (plVar10->child != (lys_node *)0x0 &&
                       (plVar10->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN);
              if (plVar10 == plVar4) break;
              plVar14 = plVar10->next;
              if (plVar10->next == (lys_node *)0x0) {
                do {
                  plVar10 = plVar10->parent;
                  LVar13 = plVar10->nodetype;
                  if (LVar13 == LYS_AUGMENT) {
                    plVar10 = plVar10->prev;
                    if (plVar10 != (lys_node *)0x0) {
                      LVar13 = plVar10->nodetype;
                      goto LAB_00156d21;
                    }
                    plVar10 = (lys_node *)0x0;
LAB_00156d4f:
                    plVar14 = (lys_node *)0x0;
                  }
                  else {
LAB_00156d21:
                    if (LVar13 != LYS_EXT) {
                      plVar14 = plVar10->parent;
                      if (plVar14 != (lys_node *)0x0) goto LAB_00156d3e;
                      goto LAB_00156d4f;
                    }
                    if (plVar10->padding[1] != '\x01') goto LAB_00156d4f;
                    plVar14 = (lys_node *)plVar10->dsc;
LAB_00156d3e:
                    if (plVar14->nodetype == LYS_AUGMENT) {
                      plVar14 = plVar14->prev;
                    }
                  }
                  if (plVar4->nodetype == LYS_EXT) {
                    if (plVar4->padding[1] == '\x01') {
                      plVar15 = (lys_node *)plVar4->dsc;
                      goto LAB_00156d6e;
                    }
LAB_00156d7e:
                    plVar15 = (lys_node *)0x0;
                  }
                  else {
                    plVar15 = plVar4->parent;
                    if (plVar15 == (lys_node *)0x0) goto LAB_00156d7e;
LAB_00156d6e:
                    if (plVar15->nodetype == LYS_AUGMENT) {
                      plVar15 = plVar15->prev;
                    }
                  }
                  if (plVar14 == plVar15) goto LAB_00156b07;
                  plVar14 = plVar10->next;
                } while (plVar10->next == (lys_node *)0x0);
              }
            }
          }
        }
        else {
          plVar4->module = module;
          shallow = 1;
        }
LAB_00156b07:
        lys_node_free(plVar4,(_func_void_lys_node_ptr_void_ptr *)0x0,shallow);
        if (plVar3[uVar16].deviate_size != '\0') {
          uVar17 = 0;
          do {
            lys_extension_instances_free
                      (ctx_00,plVar3[uVar16].deviate[uVar17].ext,
                       (uint)plVar3[uVar16].deviate[uVar17].ext_size);
            plVar9 = plVar3[uVar16].deviate;
            if (plVar9[uVar17].dflt_size != '\0') {
              uVar12 = 0;
              do {
                lydict_remove(ctx_00,plVar9[uVar17].dflt[uVar12]);
                uVar12 = uVar12 + 1;
                plVar9 = plVar3[uVar16].deviate;
              } while (uVar12 < plVar9[uVar17].dflt_size);
            }
            free(plVar9[uVar17].dflt);
            lydict_remove(ctx_00,plVar3[uVar16].deviate[uVar17].units);
            plVar9 = plVar3[uVar16].deviate;
            if (plVar9[uVar17].mod == LY_DEVIATE_DEL) {
              if (plVar9[uVar17].must_size != '\0') {
                lVar11 = 0;
                uVar12 = 0;
                do {
                  lys_restr_free(ctx_00,(lys_restr *)((long)&(plVar9[uVar17].must)->expr + lVar11));
                  uVar12 = uVar12 + 1;
                  plVar9 = plVar3[uVar16].deviate;
                  lVar11 = lVar11 + 0x38;
                } while (uVar12 < plVar9[uVar17].must_size);
              }
              free(plVar9[uVar17].must);
              plVar9 = plVar3[uVar16].deviate;
              if (plVar9[uVar17].unique_size != '\0') {
                uVar12 = 0;
                do {
                  plVar8 = plVar9[uVar17].unique + uVar12;
                  if (plVar9[uVar17].unique[uVar12].expr_size != '\0') {
                    uVar18 = 0;
                    do {
                      lydict_remove(ctx_00,plVar8->expr[uVar18]);
                      uVar18 = uVar18 + 1;
                      plVar5 = plVar3[uVar16].deviate[uVar17].unique;
                      plVar8 = plVar5 + uVar12;
                    } while (uVar18 < plVar5[uVar12].expr_size);
                  }
                  free(plVar8->expr);
                  uVar12 = uVar12 + 1;
                  plVar9 = plVar3[uVar16].deviate;
                } while (uVar12 < plVar9[uVar17].unique_size);
              }
              free(plVar9[uVar17].unique);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < plVar3[uVar16].deviate_size);
        }
        free(plVar3[uVar16].deviate);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < module->deviation_size);
  }
  free(module->deviation);
  if (module->extensions_size != '\0') {
    lVar11 = 0x28;
    uVar16 = 0;
    do {
      plVar6 = module->extensions;
      lydict_remove(ctx,*(char **)(plVar6->padding + lVar11 + -0x43));
      lydict_remove(ctx,*(char **)(plVar6->padding + lVar11 + -0x3b));
      lydict_remove(ctx,*(char **)(plVar6->padding + lVar11 + -0x33));
      lydict_remove(ctx,*(char **)(plVar6->padding + lVar11 + -0x1b));
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)(plVar6->padding + lVar11 + -0x23),
                 (uint)plVar6->padding[lVar11 + -0x29]);
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x40;
    } while (uVar16 < module->extensions_size);
  }
  free(module->extensions);
  lydict_remove(ctx,module->name);
  lydict_remove(ctx,module->prefix);
  return;
}

Assistant:

static void
module_free_common(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    struct ly_ctx *ctx;
    struct lys_node *next, *iter;
    unsigned int i;

    assert(module->ctx);
    ctx = module->ctx;

    /* just free the import array, imported modules will stay in the context */
    for (i = 0; i < module->imp_size; i++) {
        lydict_remove(ctx, module->imp[i].prefix);
        lydict_remove(ctx, module->imp[i].dsc);
        lydict_remove(ctx, module->imp[i].ref);
        lys_extension_instances_free(ctx, module->imp[i].ext, module->imp[i].ext_size);
    }
    free(module->imp);

    /* submodules don't have data tree, the data nodes
     * are placed in the main module altogether */
    if (!module->type) {
        LY_TREE_FOR_SAFE(module->data, next, iter) {
            lys_node_free(iter, private_destructor, 0);
        }
    }

    lydict_remove(ctx, module->dsc);
    lydict_remove(ctx, module->ref);
    lydict_remove(ctx, module->org);
    lydict_remove(ctx, module->contact);
    lydict_remove(ctx, module->filepath);

    /* revisions */
    for (i = 0; i < module->rev_size; i++) {
        lys_extension_instances_free(ctx, module->rev[i].ext, module->rev[i].ext_size);
        lydict_remove(ctx, module->rev[i].dsc);
        lydict_remove(ctx, module->rev[i].ref);
    }
    free(module->rev);

    /* identities */
    for (i = 0; i < module->ident_size; i++) {
        lys_ident_free(ctx, &module->ident[i]);
    }
    module->ident_size = 0;
    free(module->ident);

    /* typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        lys_tpdf_free(ctx, &module->tpdf[i]);
    }
    free(module->tpdf);

    /* extension instances */
    lys_extension_instances_free(ctx, module->ext, module->ext_size);

    /* include */
    for (i = 0; i < module->inc_size; i++) {
        lydict_remove(ctx, module->inc[i].dsc);
        lydict_remove(ctx, module->inc[i].ref);
        lys_extension_instances_free(ctx, module->inc[i].ext, module->inc[i].ext_size);
        /* complete submodule free is done only from main module since
         * submodules propagate their includes to the main module */
        if (!module->type) {
            lys_submodule_free(module->inc[i].submodule, private_destructor);
        }
    }
    free(module->inc);

    /* augment */
    for (i = 0; i < module->augment_size; i++) {
        lys_augment_free(ctx, &module->augment[i], private_destructor);
    }
    free(module->augment);

    /* features */
    for (i = 0; i < module->features_size; i++) {
        lys_feature_free(ctx, &module->features[i]);
    }
    free(module->features);

    /* deviations */
    for (i = 0; i < module->deviation_size; i++) {
        lys_deviation_free(module, &module->deviation[i]);
    }
    free(module->deviation);

    /* extensions */
    for (i = 0; i < module->extensions_size; i++) {
        lys_extension_free(ctx, &module->extensions[i]);
    }
    free(module->extensions);

    lydict_remove(ctx, module->name);
    lydict_remove(ctx, module->prefix);
}